

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O0

void __thiscall tri_cc_geom_t::clear(tri_cc_geom_t *this)

{
  tri_cc_geom_t *this_local;
  
  boost::shared_ptr<tri_cc_t>::reset(&this->m_tri_cc);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::clear(&this->m_cell_pos);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::clear(&this->m_cell_normal);
  return;
}

Assistant:

void tri_cc_geom_t::clear()
{
  m_tri_cc.reset();

  m_cell_pos.clear();

  m_cell_normal.clear();
}